

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void * __thiscall asmjit::Zone::allocZeroed(Zone *this,size_t size)

{
  void *__s;
  ulong in_RSI;
  ulong *in_RDI;
  Zone *unaff_retaddr;
  void *p;
  size_t remainingBytes;
  uint8_t *ptr;
  char *in_stack_000003a0;
  int in_stack_000003ac;
  char *in_stack_000003b0;
  size_t in_stack_fffffffffffffff8;
  
  __s = (void *)*in_RDI;
  if (in_RDI[1] - (long)__s < in_RSI) {
    __s = _alloc(unaff_retaddr,in_stack_fffffffffffffff8);
  }
  else {
    *in_RDI = in_RSI + *in_RDI;
    if (in_RDI[1] < *in_RDI) {
      DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
    }
  }
  if (__s != (void *)0x0) {
    memset(__s,0,in_RSI);
  }
  return __s;
}

Assistant:

void* Zone::allocZeroed(size_t size) noexcept {
  void* p = alloc(size);
  if (ASMJIT_UNLIKELY(!p)) return p;
  return ::memset(p, 0, size);
}